

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TIntermediate::setAggregateOperator
          (TIntermediate *this,TIntermNode *node,TOperator op,TType *type,TSourceLoc *loc)

{
  iterator __position;
  int iVar1;
  undefined4 extraout_var;
  TPoolAllocator *pTVar2;
  TIntermAggregate *this_00;
  vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *this_01;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar3;
  TIntermNode *local_38;
  undefined4 extraout_var_00;
  
  local_38 = node;
  if (node == (TIntermNode *)0x0) {
    pTVar2 = GetThreadPoolAllocator();
    this_00 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar2,0x188);
    TIntermAggregate::TIntermAggregate(this_00);
  }
  else {
    iVar1 = (*node->_vptr_TIntermNode[6])(node);
    this_00 = (TIntermAggregate *)CONCAT44(extraout_var,iVar1);
    if ((this_00 == (TIntermAggregate *)0x0) || ((this_00->super_TIntermOperator).op != EOpNull)) {
      pTVar2 = GetThreadPoolAllocator();
      this_00 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar2,0x188);
      TIntermAggregate::TIntermAggregate(this_00);
      iVar1 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(this_00);
      this_01 = (vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                CONCAT44(extraout_var_00,iVar1);
      __position._M_current = *(TIntermNode ***)(this_01 + 0x10);
      if (__position._M_current == *(TIntermNode ***)(this_01 + 0x18)) {
        std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
        _M_realloc_insert<TIntermNode*const&>(this_01,__position,&local_38);
      }
      else {
        *__position._M_current = node;
        *(long *)(this_01 + 0x10) = *(long *)(this_01 + 0x10) + 8;
      }
    }
  }
  (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
            (this_00,(ulong)op);
  if (local_38 != (TIntermNode *)0x0 || loc->line != 0) {
    if (loc->line == 0) {
      iVar1 = (**local_38->_vptr_TIntermNode)();
      loc = (TSourceLoc *)CONCAT44(extraout_var_01,iVar1);
    }
    (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
              (this_00,loc);
  }
  (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
            (this_00,type);
  pTVar3 = fold(this,this_00);
  return pTVar3;
}

Assistant:

TIntermTyped* TIntermediate::setAggregateOperator(TIntermNode* node, TOperator op, const TType& type,
    const TSourceLoc& loc)
{
    TIntermAggregate* aggNode;

    //
    // Make sure we have an aggregate.  If not turn it into one.
    //
    if (node != nullptr) {
        aggNode = node->getAsAggregate();
        if (aggNode == nullptr || aggNode->getOp() != EOpNull) {
            //
            // Make an aggregate containing this node.
            //
            aggNode = new TIntermAggregate();
            aggNode->getSequence().push_back(node);
        }
    } else
        aggNode = new TIntermAggregate();

    //
    // Set the operator.
    //
    aggNode->setOperator(op);
    if (loc.line != 0 || node != nullptr)
        aggNode->setLoc(loc.line != 0 ? loc : node->getLoc());

    aggNode->setType(type);

    return fold(aggNode);
}